

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

void __thiscall
deqp::gls::BuiltinPrecisionTests::PrecisionCase::
testStatement<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,3>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>,deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,3>,tcu::Vector<int,3>>>
          (PrecisionCase *this,
          Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,_3>,_tcu::Vector<int,_3>_>_>
          *variables,
          Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *inputs,Statement *stmt)

{
  _Rb_tree_node_base *p_Var1;
  pointer pVVar2;
  pointer pVVar3;
  Variable<tcu::Vector<float,_3>_> *pVVar4;
  pointer pcVar5;
  Variable<tcu::Vector<int,_3>_> *pVVar6;
  PrecisionCase *pPVar7;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,_3>,_tcu::Vector<int,_3>_>_>
  *pVVar8;
  undefined8 uVar9;
  bool bVar10;
  bool bVar11;
  ContextType type;
  int iVar12;
  uint uVar13;
  _Rb_tree_node_base *p_Var14;
  char *__s;
  size_t sVar15;
  long *plVar16;
  ShaderExecutor *pSVar17;
  long lVar18;
  IVal *pIVar19;
  IVal *pIVar20;
  TestError *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar21;
  Vector<float,_3> *val;
  size_t sVar22;
  MessageBuilder *pMVar23;
  ulong uVar24;
  byte bVar25;
  IVal in2;
  IVal in1;
  IVal in3;
  ostringstream os;
  FloatFormat highpFmt;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,_3>,_tcu::Vector<int,_3>_>_>
  outputs;
  FuncSet funcs;
  Environment env;
  ShaderSpec spec;
  ostringstream oss;
  undefined1 auStack_548 [8];
  PrecisionCase *local_540;
  undefined1 local_538 [12];
  undefined4 uStack_52c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_528;
  Statement *local_518;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,_3>,_tcu::Vector<int,_3>_>_>
  *local_510;
  undefined1 local_508 [16];
  undefined1 local_4f8 [56];
  string local_4c0;
  size_t local_4a0;
  ulong local_498;
  Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *local_490;
  FloatFormat *local_488;
  ResultCollector *local_480;
  undefined1 local_478 [8];
  pointer pVStack_470;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_468;
  double local_458;
  Data local_450;
  undefined4 local_440;
  ios_base local_408 [8];
  ios_base local_400 [264];
  FloatFormat local_2f8;
  ulong local_2d0;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,_3>,_tcu::Vector<int,_3>_>_>
  local_2c8;
  undefined1 local_298 [16];
  _Base_ptr local_288;
  _Rb_tree_node_base *local_280;
  _Rb_tree_node_base *local_278;
  double local_270;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_250;
  undefined1 local_220 [56];
  _Alloc_hider local_1e8;
  size_type local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  _Alloc_hider local_1c8;
  size_type local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  bVar25 = 0;
  pVVar2 = (inputs->in0).
           super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar3 = (inputs->in0).
           super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  sVar22 = ((long)pVVar3 - (long)pVVar2 >> 2) * -0x5555555555555555;
  local_518 = stmt;
  local_490 = inputs;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,_3>,_tcu::Vector<int,_3>_>_>
  ::Outputs(&local_2c8,sVar22);
  local_1e8._M_p = (pointer)&local_1d8;
  local_220._0_4_ = GLSL_VERSION_300_ES;
  local_220._8_8_ = (pointer)0x0;
  local_220._16_8_ = (pointer)0x0;
  local_220._24_8_ = (pointer)0x0;
  local_220._32_8_ = (pointer)0x0;
  local_220._40_8_ = (pointer)0x0;
  local_220._48_8_ = (pointer)0x0;
  local_1e0 = 0;
  local_1d8._M_local_buf[0] = '\0';
  local_1c8._M_p = (pointer)&local_1b8;
  local_1c0 = 0;
  local_1b8._M_local_buf[0] = '\0';
  local_2f8.m_maxValue = (this->m_ctx).highpFormat.m_maxValue;
  local_2f8.m_minExp = (this->m_ctx).highpFormat.m_minExp;
  local_2f8.m_maxExp = (this->m_ctx).highpFormat.m_maxExp;
  local_2f8.m_fractionBits = (this->m_ctx).highpFormat.m_fractionBits;
  local_2f8.m_hasSubnormal = (this->m_ctx).highpFormat.m_hasSubnormal;
  local_2f8.m_hasInf = (this->m_ctx).highpFormat.m_hasInf;
  local_2f8.m_hasNaN = (this->m_ctx).highpFormat.m_hasNaN;
  local_2f8.m_exactPrecision = (this->m_ctx).highpFormat.m_exactPrecision;
  local_2f8._25_7_ = *(undefined7 *)&(this->m_ctx).highpFormat.field_0x19;
  local_250._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_250._M_impl.super__Rb_tree_header._M_header;
  local_250._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_250._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_250._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_478 = (undefined1  [8])((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  local_540 = this;
  local_250._M_impl.super__Rb_tree_header._M_header._M_right =
       local_250._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_470);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_470,"Statement: ",0xb);
  (*local_518->_vptr_Statement[2])(local_518,(ostringstream *)&pVStack_470);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_478,(EndMessageToken *)&tcu::TestLog::EndMessage);
  local_4a0 = sVar22;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_470);
  std::ios_base::~ios_base(local_400);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  p_Var1 = (_Rb_tree_node_base *)(local_298 + 8);
  local_298._8_4_ = _S_red;
  local_288 = (_Base_ptr)0x0;
  local_270 = 0.0;
  local_280 = p_Var1;
  local_278 = p_Var1;
  (*local_518->_vptr_Statement[4])(local_518,local_298);
  if (local_280 != p_Var1) {
    p_Var14 = local_280;
    do {
      (**(code **)(**(long **)(p_Var14 + 1) + 0x30))(*(long **)(p_Var14 + 1),local_1a8);
      p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14);
    } while (p_Var14 != p_Var1);
  }
  if (local_270 != 0.0) {
    local_478 = (undefined1  [8])((local_540->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_470);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pVStack_470,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pVStack_470,(char *)local_508._0_8_,local_508._8_8_);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_478,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((IVal *)local_508._0_8_ != (IVal *)local_4f8) {
      operator_delete((void *)local_508._0_8_,local_4f8._0_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_470);
    std::ios_base::~ios_base(local_400);
  }
  std::
  _Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
               *)local_298);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_478);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_478,"precision ",10);
  __s = glu::getPrecisionName((local_540->m_ctx).precision);
  if (__s == (char *)0x0) {
    std::ios::clear((int)(auStack_548 + *(long *)((long)local_478 + -0x18)) + 0xd0);
  }
  else {
    sVar15 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_478,__s,sVar15);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_478," float;\n",8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_1e8,(string *)local_1a8);
  pcVar5 = local_1a8 + 0x10;
  if ((pointer)local_1a8._0_8_ != pcVar5) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_478);
  std::ios_base::~ios_base(local_408);
  type.super_ApiType.m_bits =
       (ApiType)(*((local_540->m_ctx).renderContext)->_vptr_RenderContext[2])();
  local_220._0_4_ = glu::getContextTypeGLSLVersion(type);
  local_510 = variables;
  if ((local_540->m_extension)._M_string_length != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                   "#extension ",&local_540->m_extension);
    plVar16 = (long *)std::__cxx11::string::append(local_1a8);
    paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar16 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar16 == paVar21) {
      local_468._M_allocated_capacity = paVar21->_M_allocated_capacity;
      local_468._8_8_ = plVar16[3];
      local_478 = (undefined1  [8])&local_468;
    }
    else {
      local_468._M_allocated_capacity = paVar21->_M_allocated_capacity;
      local_478 = (undefined1  [8])*plVar16;
    }
    pVStack_470 = (pointer)plVar16[1];
    *plVar16 = (long)paVar21;
    plVar16[1] = 0;
    *(undefined1 *)(plVar16 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_1e8,(string *)local_478);
    if (local_478 != (undefined1  [8])&local_468) {
      operator_delete((void *)local_478,local_468._M_allocated_capacity + 1);
    }
    variables = local_510;
    if ((pointer)local_1a8._0_8_ != pcVar5) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_220 + 8),1);
  makeSymbol<tcu::Vector<float,3>>
            ((Symbol *)local_478,local_540,
             (variables->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
             .m_ptr);
  uVar9 = local_220._8_8_;
  std::__cxx11::string::operator=((string *)local_220._8_8_,(string *)local_478);
  glu::VarType::operator=((VarType *)(uVar9 + 0x20),(VarType *)&local_458);
  glu::VarType::~VarType((VarType *)&local_458);
  if (local_478 != (undefined1  [8])&local_468) {
    operator_delete((void *)local_478,local_468._M_allocated_capacity + 1);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_220 + 0x20),2);
  makeSymbol<tcu::Vector<int,3>>
            ((Symbol *)local_478,local_540,
             (variables->out1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<int,_3>_>_>
             .m_ptr);
  uVar9 = local_220._32_8_;
  std::__cxx11::string::operator=((string *)(local_220._32_8_ + 0x38),(string *)local_478);
  glu::VarType::operator=(&((pointer)(uVar9 + 0x38))->varType,(VarType *)&local_458);
  glu::VarType::~VarType((VarType *)&local_458);
  if (local_478 != (undefined1  [8])&local_468) {
    operator_delete((void *)local_478,local_468._M_allocated_capacity + 1);
  }
  makeSymbol<tcu::Vector<float,3>>
            ((Symbol *)local_478,local_540,
             (variables->out0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
             .m_ptr);
  uVar9 = local_220._32_8_;
  std::__cxx11::string::operator=((string *)local_220._32_8_,(string *)local_478);
  glu::VarType::operator=((VarType *)(uVar9 + 0x20),(VarType *)&local_458);
  glu::VarType::~VarType((VarType *)&local_458);
  if (local_478 != (undefined1  [8])&local_468) {
    operator_delete((void *)local_478,local_468._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_478);
  (*local_518->_vptr_Statement[2])(local_518,local_478);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_478);
  std::ios_base::~ios_base(local_408);
  std::__cxx11::string::operator=((string *)&local_1c8,(string *)local_1a8);
  if ((pointer)local_1a8._0_8_ != pcVar5) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  pPVar7 = local_540;
  pSVar17 = ShaderExecUtil::createExecutor
                      ((local_540->m_ctx).renderContext,(local_540->m_ctx).shaderType,
                       (ShaderSpec *)local_220);
  sVar22 = local_4a0;
  local_478 = (undefined1  [8])
              (local_490->in0).
              super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  pVStack_470 = (local_490->in1).
                super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_468._M_allocated_capacity =
       (size_type)
       (local_490->in2).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_468._8_8_ =
       (local_490->in3).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1a8._0_8_ =
       local_2c8.out0.
       super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_1a8._8_8_ =
       local_2c8.out1.super__Vector_base<tcu::Vector<int,_3>,_std::allocator<tcu::Vector<int,_3>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (*pSVar17->_vptr_ShaderExecutor[3])
            (pSVar17,((pPVar7->super_TestCase).super_TestNode.m_testCtx)->m_log);
  iVar12 = (*pSVar17->_vptr_ShaderExecutor[2])(pSVar17);
  if ((char)iVar12 == '\0') {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Shader compilation failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsBuiltinPrecisionTests.cpp"
               ,0x11d4);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (*pSVar17->_vptr_ShaderExecutor[5])(pSVar17);
  (*pSVar17->_vptr_ShaderExecutor[6])(pSVar17,sVar22 & 0xffffffff,local_478,local_1a8);
  local_488 = &(pPVar7->m_ctx).floatFormat;
  (*pSVar17->_vptr_ShaderExecutor[1])(pSVar17);
  lVar18 = 8;
  do {
    *(undefined1 *)((long)&local_480 + lVar18) = 0;
    *(undefined8 *)(local_478 + lVar18) = 0x7ff0000000000000;
    *(undefined8 *)((long)&pVStack_470 + lVar18) = 0xfff0000000000000;
    lVar18 = lVar18 + 0x18;
  } while (lVar18 != 0x50);
  lVar18 = 8;
  do {
    *(undefined1 *)((long)&local_480 + lVar18) = 0;
    *(undefined8 *)(local_478 + lVar18) = 0x7ff0000000000000;
    *(undefined8 *)((long)&pVStack_470 + lVar18) = 0xfff0000000000000;
    lVar18 = lVar18 + 0x18;
  } while (lVar18 != 0x50);
  lVar18 = 8;
  do {
    local_1a8[lVar18 + -8] = 0;
    *(undefined8 *)(local_1a8 + lVar18) = 0x7ff0000000000000;
    *(undefined8 *)(local_1a8 + lVar18 + 8) = 0xfff0000000000000;
    lVar18 = lVar18 + 0x18;
  } while (lVar18 != 0x50);
  lVar18 = 8;
  do {
    local_1a8[lVar18 + -8] = 0;
    *(undefined8 *)(local_1a8 + lVar18) = 0x7ff0000000000000;
    *(undefined8 *)(local_1a8 + lVar18 + 8) = 0xfff0000000000000;
    lVar18 = lVar18 + 0x18;
  } while (lVar18 != 0x50);
  lVar18 = 8;
  do {
    local_298[lVar18 + -8] = 0;
    *(undefined8 *)(local_298 + lVar18) = 0x7ff0000000000000;
    *(undefined8 *)(local_298 + lVar18 + 8) = 0xfff0000000000000;
    lVar18 = lVar18 + 0x18;
  } while (lVar18 != 0x50);
  lVar18 = 8;
  do {
    local_298[lVar18 + -8] = 0;
    *(undefined8 *)(local_298 + lVar18) = 0x7ff0000000000000;
    *(undefined8 *)(local_298 + lVar18 + 8) = 0xfff0000000000000;
    lVar18 = lVar18 + 0x18;
  } while (lVar18 != 0x50);
  Environment::bind<tcu::Vector<float,3>>
            ((Environment *)&local_250,
             (variables->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
             .m_ptr,(IVal *)local_478);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_250,
             (variables->in1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)local_508);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_250,
             (variables->in2).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)local_538);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_250,
             (variables->in3).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)(local_4f8 + 0x38));
  Environment::bind<tcu::Vector<float,3>>
            ((Environment *)&local_250,
             (variables->out0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
             .m_ptr,(IVal *)local_1a8);
  Environment::bind<tcu::Vector<int,3>>
            ((Environment *)&local_250,
             (variables->out1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<int,_3>_>_>
             .m_ptr,(IVal *)local_298);
  if (pVVar3 == pVVar2) {
LAB_008ced86:
    local_478 = (undefined1  [8])((local_540->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_470);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_470,"All ",4);
    std::ostream::_M_insert<unsigned_long>((ulong)&pVStack_470);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pVStack_470," inputs passed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_478,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_480 = &local_540->m_status;
    local_2d0 = sVar22 + (sVar22 == 0);
    uVar24 = 0;
    local_498 = 0;
    do {
      lVar18 = 8;
      do {
        local_1a8[lVar18 + -8] = 0;
        *(undefined8 *)(local_1a8 + lVar18) = 0x7ff0000000000000;
        *(undefined8 *)(local_1a8 + lVar18 + 8) = 0xfff0000000000000;
        lVar18 = lVar18 + 0x18;
      } while (lVar18 != 0x50);
      lVar18 = 8;
      do {
        local_1a8[lVar18 + -8] = 0;
        *(undefined8 *)(local_1a8 + lVar18) = 0x7ff0000000000000;
        *(undefined8 *)(local_1a8 + lVar18 + 8) = 0xfff0000000000000;
        lVar18 = lVar18 + 0x18;
      } while (lVar18 != 0x50);
      lVar18 = 8;
      do {
        local_298[lVar18 + -8] = 0;
        *(undefined8 *)(local_298 + lVar18) = 0x7ff0000000000000;
        *(undefined8 *)(local_298 + lVar18 + 8) = 0xfff0000000000000;
        lVar18 = lVar18 + 0x18;
      } while (lVar18 != 0x50);
      lVar18 = 8;
      do {
        local_298[lVar18 + -8] = 0;
        *(undefined8 *)(local_298 + lVar18) = 0x7ff0000000000000;
        *(undefined8 *)(local_298 + lVar18 + 8) = 0xfff0000000000000;
        lVar18 = lVar18 + 0x18;
      } while (lVar18 != 0x50);
      if ((uVar24 & 0xfff) == 0) {
        tcu::TestContext::touchWatchdog((local_540->super_TestCase).super_TestNode.m_testCtx);
      }
      pVVar2 = (local_490->in0).
               super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_538._8_4_ = pVVar2[uVar24].m_data[2];
      local_538._0_8_ = *(undefined8 *)pVVar2[uVar24].m_data;
      ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doRound
                ((IVal *)local_508,local_488,(Vector<float,_3> *)local_538);
      pVVar8 = local_510;
      ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doConvert
                ((IVal *)local_478,local_488,(IVal *)local_508);
      pIVar19 = Environment::lookup<tcu::Vector<float,3>>
                          ((Environment *)&local_250,
                           (pVVar8->in0).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
                           .m_ptr);
      pMVar23 = (MessageBuilder *)local_478;
      for (lVar18 = 9; lVar18 != 0; lVar18 = lVar18 + -1) {
        *(TestLog **)pIVar19->m_data = pMVar23->m_log;
        pMVar23 = (MessageBuilder *)((long)pMVar23 + (ulong)bVar25 * -0x10 + 8);
        pIVar19 = (IVal *)((long)pIVar19 + ((ulong)bVar25 * -2 + 1) * 8);
      }
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_250,
                 (pVVar8->in1).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_250,
                 (pVVar8->in2).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_250,
                 (pVVar8->in3).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      local_450.basic.type = (local_540->m_ctx).precision;
      local_458 = local_488->m_maxValue;
      local_478 = *(undefined1 (*) [8])local_488;
      pVStack_470 = *(pointer *)&local_488->m_fractionBits;
      local_468._M_allocated_capacity = *(undefined8 *)&local_488->m_hasInf;
      local_468._8_8_ = *(undefined8 *)&local_488->m_exactPrecision;
      local_440 = 0;
      local_450._8_8_ = &local_250;
      (*local_518->_vptr_Statement[3])(local_518,(MessageBuilder *)local_478);
      pIVar20 = Environment::lookup<tcu::Vector<int,3>>
                          ((Environment *)&local_250,
                           (pVVar8->out1).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<int,_3>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Vector<int,_3>,_tcu::Vector<tcu::Interval,_3>_>::doConvert
                ((IVal *)local_478,&local_2f8,pIVar20);
      pMVar23 = (MessageBuilder *)local_478;
      pIVar20 = (IVal *)local_298;
      for (lVar18 = 9; lVar18 != 0; lVar18 = lVar18 + -1) {
        *(TestLog **)pIVar20->m_data = pMVar23->m_log;
        pMVar23 = (MessageBuilder *)((long)pMVar23 + (ulong)bVar25 * -0x10 + 8);
        pIVar20 = (IVal *)((long)pIVar20 + ((ulong)bVar25 * -2 + 1) * 8);
      }
      bVar10 = contains<tcu::Vector<int,3>>
                         ((IVal *)local_298,
                          local_2c8.out1.
                          super__Vector_base<tcu::Vector<int,_3>,_std::allocator<tcu::Vector<int,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar24);
      local_478 = (undefined1  [8])&local_468;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_478,"Shader output 1 is outside acceptable range","");
      bVar10 = tcu::ResultCollector::check(local_480,bVar10,(string *)local_478);
      if (local_478 != (undefined1  [8])&local_468) {
        operator_delete((void *)local_478,(ulong)(local_468._M_allocated_capacity + 1));
      }
      pIVar19 = Environment::lookup<tcu::Vector<float,3>>
                          ((Environment *)&local_250,
                           (local_510->out0).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doConvert
                ((IVal *)local_478,&local_2f8,pIVar19);
      pMVar23 = (MessageBuilder *)local_478;
      pIVar19 = (IVal *)local_1a8;
      for (lVar18 = 9; lVar18 != 0; lVar18 = lVar18 + -1) {
        *(TestLog **)pIVar19->m_data = pMVar23->m_log;
        pMVar23 = (MessageBuilder *)((long)pMVar23 + (ulong)bVar25 * -0x10 + 8);
        pIVar19 = (IVal *)((long)pIVar19 + ((ulong)bVar25 * -2 + 1) * 8);
      }
      bVar11 = ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doContains
                         ((IVal *)local_1a8,
                          local_2c8.out0.
                          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar24);
      local_478 = (undefined1  [8])&local_468;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_478,"Shader output 0 is outside acceptable range","");
      bVar11 = tcu::ResultCollector::check(local_480,bVar11,(string *)local_478);
      if (local_478 != (undefined1  [8])&local_468) {
        operator_delete((void *)local_478,(ulong)(local_468._M_allocated_capacity + 1));
      }
      pVVar8 = local_510;
      if (!bVar10 || !bVar11) {
        uVar13 = (int)local_498 + 1;
        local_498 = (ulong)uVar13;
        if ((int)uVar13 < 0x65) {
          local_478 = (undefined1  [8])((local_540->super_TestCase).super_TestNode.m_testCtx)->m_log
          ;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_470);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_470,"Failed",6);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_470," sample:\n",9)
          ;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_470,"\t",1);
          pVVar4 = (pVVar8->in0).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
                   .m_ptr;
          val = (Vector<float,_3> *)local_4f8;
          pcVar5 = (pVVar4->m_name)._M_dataplus._M_p;
          local_508._0_8_ = val;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_508,pcVar5,pcVar5 + (pVVar4->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_470,(char *)local_508._0_8_,local_508._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_470," = ",3);
          valueToString<tcu::Vector<float,3>>
                    ((string *)local_538,(BuiltinPrecisionTests *)&local_2f8,
                     (FloatFormat *)
                     ((local_490->in0).
                      super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar24),val);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_470,(char *)local_538._0_8_,
                     CONCAT44(uStack_52c,local_538._8_4_));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_470,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_538._0_8_ != &local_528) {
            operator_delete((void *)local_538._0_8_,local_528._M_allocated_capacity + 1);
          }
          if ((Vector<float,_3> *)local_508._0_8_ != (Vector<float,_3> *)local_4f8) {
            operator_delete((void *)local_508._0_8_,local_4f8._0_8_ + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_470,"\t",1);
          pVVar4 = (pVVar8->out0).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
                   .m_ptr;
          pIVar19 = (IVal *)local_4f8;
          pcVar5 = (pVVar4->m_name)._M_dataplus._M_p;
          local_508._0_8_ = pIVar19;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_508,pcVar5,pcVar5 + (pVVar4->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_470,(char *)local_508._0_8_,local_508._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_470," = ",3);
          valueToString<tcu::Vector<float,3>>
                    ((string *)local_538,(BuiltinPrecisionTests *)&local_2f8,
                     (FloatFormat *)
                     (local_2c8.out0.
                      super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar24),
                     (Vector<float,_3> *)pIVar19);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_470,(char *)local_538._0_8_,
                     CONCAT44(uStack_52c,local_538._8_4_));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_470,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_470,"\tExpected range: ",0x11);
          intervalToString<tcu::Vector<float,3>>
                    ((string *)(local_4f8 + 0x38),(BuiltinPrecisionTests *)&local_2f8,
                     (FloatFormat *)local_1a8,pIVar19);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_470,local_4c0._M_dataplus._M_p,local_4c0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_470,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
            operator_delete(local_4c0._M_dataplus._M_p,local_4c0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_538._0_8_ != &local_528) {
            operator_delete((void *)local_538._0_8_,local_528._M_allocated_capacity + 1);
          }
          if ((IVal *)local_508._0_8_ != (IVal *)local_4f8) {
            operator_delete((void *)local_508._0_8_,local_4f8._0_8_ + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_470,"\t",1);
          pVVar6 = (pVVar8->out1).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<int,_3>_>_>
                   .m_ptr;
          pIVar20 = (IVal *)local_4f8;
          pcVar5 = (pVVar6->m_name)._M_dataplus._M_p;
          local_508._0_8_ = pIVar20;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_508,pcVar5,pcVar5 + (pVVar6->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_470,(char *)local_508._0_8_,local_508._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_470," = ",3);
          valueToString<tcu::Vector<int,3>>
                    ((string *)local_538,(BuiltinPrecisionTests *)&local_2f8,
                     (FloatFormat *)
                     (local_2c8.out1.
                      super__Vector_base<tcu::Vector<int,_3>,_std::allocator<tcu::Vector<int,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar24),(Vector<int,_3> *)pIVar20)
          ;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_470,(char *)local_538._0_8_,
                     CONCAT44(uStack_52c,local_538._8_4_));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_470,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_470,"\tExpected range: ",0x11);
          intervalToString<tcu::Vector<int,3>>
                    ((string *)(local_4f8 + 0x38),(BuiltinPrecisionTests *)&local_2f8,
                     (FloatFormat *)local_298,pIVar20);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_470,local_4c0._M_dataplus._M_p,local_4c0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_470,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
            operator_delete(local_4c0._M_dataplus._M_p,local_4c0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_538._0_8_ != &local_528) {
            operator_delete((void *)local_538._0_8_,local_528._M_allocated_capacity + 1);
          }
          if ((IVal *)local_508._0_8_ != (IVal *)local_4f8) {
            operator_delete((void *)local_508._0_8_,local_4f8._0_8_ + 1);
          }
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_478,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_470);
          std::ios_base::~ios_base(local_400);
        }
      }
      uVar24 = uVar24 + 1;
    } while (uVar24 != local_2d0);
    iVar12 = (int)local_498;
    if (iVar12 < 0x65) {
      if (iVar12 == 0) goto LAB_008ced86;
    }
    else {
      local_478 = (undefined1  [8])((local_540->super_TestCase).super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_470);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_470,"(Skipped ",9);
      std::ostream::operator<<((ostringstream *)&pVStack_470,iVar12 + -100);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_470," messages.)",0xb);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_478,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_470);
      std::ios_base::~ios_base(local_400);
    }
    local_478 = (undefined1  [8])((local_540->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_470);
    std::ostream::operator<<((ostringstream *)&pVStack_470,iVar12);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_470,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)&pVStack_470);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pVStack_470," inputs failed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_478,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_470);
  std::ios_base::~ios_base(local_400);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_250);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_p != &local_1b8) {
    operator_delete(local_1c8._M_p,
                    CONCAT71(local_1b8._M_allocated_capacity._1_7_,local_1b8._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_p != &local_1d8) {
    operator_delete(local_1e8._M_p,
                    CONCAT71(local_1d8._M_allocated_capacity._1_7_,local_1d8._M_local_buf[0]) + 1);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_220 + 0x20));
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_220 + 8));
  if (local_2c8.out1.super__Vector_base<tcu::Vector<int,_3>,_std::allocator<tcu::Vector<int,_3>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2c8.out1.
                    super__Vector_base<tcu::Vector<int,_3>,_std::allocator<tcu::Vector<int,_3>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_2c8.out1.
                          super__Vector_base<tcu::Vector<int,_3>,_std::allocator<tcu::Vector<int,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2c8.out1.
                          super__Vector_base<tcu::Vector<int,_3>,_std::allocator<tcu::Vector<int,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2c8.out0.
      super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2c8.out0.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2c8.out0.
                          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2c8.out0.
                          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void PrecisionCase::testStatement (const Variables<In, Out>&	variables,
								   const Inputs<In>&			inputs,
								   const Statement&				stmt)
{
	using namespace ShaderExecUtil;

	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	const FloatFormat&	fmt			= getFormat();
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	ShaderSpec			spec;
	const FloatFormat	highpFmt	= m_ctx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	// Print out the statement and its definitions
	log() << TestLog::Message << "Statement: " << stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		stmt.getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			log() << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	// Initialize ShaderSpec from precision, variables and statement.
	{
		ostringstream os;
		os << "precision " << glu::getPrecisionName(m_ctx.precision) << " float;\n";
		spec.globalDeclarations = os.str();
	}

	spec.version = getContextTypeGLSLVersion(getRenderContext().getType());

	if (!m_extension.empty())
		spec.globalDeclarations = "#extension " + m_extension + " : require\n";

	spec.inputs.resize(inCount);

	switch (inCount)
	{
		case 4: spec.inputs[3] = makeSymbol(*variables.in3);
		case 3:	spec.inputs[2] = makeSymbol(*variables.in2);
		case 2:	spec.inputs[1] = makeSymbol(*variables.in1);
		case 1:	spec.inputs[0] = makeSymbol(*variables.in0);
		default: break;
	}

	spec.outputs.resize(outCount);

	switch (outCount)
	{
		case 2:	spec.outputs[1] = makeSymbol(*variables.out1);
		case 1:	spec.outputs[0] = makeSymbol(*variables.out0);
		default: break;
	}

	spec.source = de::toString(stmt);

	// Run the shader with inputs.
	{
		UniquePtr<ShaderExecutor>	executor		(createExecutor(getRenderContext(),
																	m_ctx.shaderType,
																	spec));
		const void*					inputArr[]		=
		{
			&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
		};
		void*						outputArr[]		=
		{
			&outputs.out0.front(), &outputs.out1.front(),
		};

		executor->log(log());
		if (!executor->isOk())
			TCU_FAIL("Shader compilation failed");

		executor->useProgram();
		executor->execute(int(numValues), inputArr, outputArr);
	}

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*variables.in0, in0);
		env.bind(*variables.in1, in1);
		env.bind(*variables.in2, in2);
		env.bind(*variables.in3, in3);
		env.bind(*variables.out0, reference0);
		env.bind(*variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		if (valueNdx % (size_t)TOUCH_WATCHDOG_VALUE_FREQUENCY == 0)
			m_testCtx.touchWatchdog();

		env.lookup(*variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_ctx.precision, env);
			stmt.execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*variables.out1));
				if (!m_status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*variables.out0));
				if (!m_status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= log().message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		log() << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		log() << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		log() << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}
}